

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  IfcSpatialStructureElement *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.
                              super_IfcObject + -0x18);
  this_00 = (IfcSpatialStructureElement *)
            (&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x0 +
            lVar2);
  plVar1 = (long *)(&this->field_0x178 + lVar2);
  plVar1[-0x2f] = 0x8a6a28;
  plVar1[4] = 0x8a6b18;
  plVar1[-0x1e] = 0x8a6a50;
  plVar1[-0x1c] = 0x8a6a78;
  plVar1[-0x15] = 0x8a6aa0;
  plVar1[-0xf] = 0x8a6ac8;
  plVar1[-4] = 0x8a6af0;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            (this_00,&PTR_construction_vtable_24__008a6b30);
  operator_delete(this_00,0x1b0);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}